

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiGroupData *pIVar5;
  ImGuiContext *pIVar6;
  ulong uVar7;
  char cVar8;
  ImGuiContext *g;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImRect local_30;
  ImVec2 local_20;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  uVar11 = (pIVar4->DC).GroupStack.Size;
  uVar7 = (ulong)uVar11;
  if (uVar7 == 0) {
    __assert_fail("!window->DC.GroupStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                  ,0x1bac,"void ImGui::EndGroup()");
  }
  if ((int)uVar11 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                  ,0x4e8,"T &ImVector<ImGuiGroupData>::back() [T = ImGuiGroupData]");
  }
  pIVar5 = (pIVar4->DC).GroupStack.Data;
  local_30.Min = pIVar5[uVar7 - 1].BackupCursorPos;
  IVar2 = (pIVar4->DC).CursorMaxPos;
  fVar15 = pIVar5[uVar7 - 1].BackupCursorPos.x;
  fVar16 = pIVar5[uVar7 - 1].BackupCursorPos.y;
  fVar13 = IVar2.x;
  fVar14 = IVar2.y;
  uVar10 = -(uint)(fVar15 <= fVar13);
  uVar12 = -(uint)(fVar16 <= fVar14);
  local_30.Max = (ImVec2)(CONCAT44(~uVar12 & (uint)fVar16,~uVar10 & (uint)fVar15) |
                         CONCAT44((uint)fVar14 & uVar12,(uint)fVar13 & uVar10));
  (pIVar4->DC).CursorPos = local_30.Min;
  fVar15 = pIVar5[uVar7 - 1].BackupCursorMaxPos.x;
  fVar16 = pIVar5[uVar7 - 1].BackupCursorMaxPos.y;
  uVar10 = -(uint)(fVar13 <= fVar15);
  uVar12 = -(uint)(fVar14 <= fVar16);
  (pIVar4->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar12 & (uint)fVar14,~uVar10 & (uint)fVar13) |
               CONCAT44((uint)fVar16 & uVar12,(uint)fVar15 & uVar10));
  (pIVar4->DC).Indent.x = pIVar5[uVar7 - 1].BackupIndent.x;
  (pIVar4->DC).GroupOffset.x = pIVar5[uVar7 - 1].BackupGroupOffset.x;
  (pIVar4->DC).CurrLineSize = pIVar5[uVar7 - 1].BackupCurrLineSize;
  fVar13 = pIVar5[uVar7 - 1].BackupCurrLineTextBaseOffset;
  (pIVar4->DC).CurrLineTextBaseOffset = fVar13;
  if (pIVar6->LogEnabled == true) {
    pIVar6->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar5[uVar7 - 1].EmitItem != true) goto LAB_002d3131;
  fVar14 = (pIVar4->DC).PrevLineTextBaseOffset;
  uVar11 = -(uint)(fVar13 <= fVar14);
  (pIVar4->DC).CurrLineTextBaseOffset = (float)(~uVar11 & (uint)fVar13 | (uint)fVar14 & uVar11);
  local_20.x = local_30.Max.x - local_30.Min.x;
  local_20.y = local_30.Max.y - local_30.Min.y;
  ItemSize(&local_20,0.0);
  ItemAdd(&local_30,0,(ImRect *)0x0);
  IVar3 = pIVar6->ActiveId;
  if (pIVar5[uVar7 - 1].BackupActiveIdIsAlive == IVar3) {
    if ((pIVar5[uVar7 - 1].BackupActiveIdPreviousFrameIsAlive != false) ||
       (pIVar6->ActiveIdPreviousFrameIsAlive == false)) goto LAB_002d30f2;
LAB_002d30bf:
    (pIVar4->DC).LastItemId = pIVar6->ActiveIdPreviousFrame;
    (pIVar4->DC).LastItemRect.Min = local_30.Min;
    (pIVar4->DC).LastItemRect.Max = local_30.Max;
    uVar11 = (pIVar4->DC).LastItemStatusFlags;
    (pIVar4->DC).LastItemStatusFlags = uVar11 | 0x10;
    goto LAB_002d3112;
  }
  bVar9 = pIVar6->ActiveIdIsAlive != IVar3;
  if (pIVar5[uVar7 - 1].BackupActiveIdPreviousFrameIsAlive == false) {
    cVar8 = pIVar6->ActiveIdPreviousFrameIsAlive;
    if (IVar3 != 0 && !bVar9) goto LAB_002d3082;
    if ((bool)cVar8 != false) goto LAB_002d30bf;
LAB_002d30f2:
    (pIVar4->DC).LastItemRect.Min = local_30.Min;
    (pIVar4->DC).LastItemRect.Max = local_30.Max;
    pIVar1 = &(pIVar4->DC).LastItemStatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x10;
  }
  else {
    if (IVar3 == 0 || bVar9) goto LAB_002d30f2;
    cVar8 = '\0';
LAB_002d3082:
    (pIVar4->DC).LastItemId = IVar3;
    (pIVar4->DC).LastItemRect.Min = local_30.Min;
    (pIVar4->DC).LastItemRect.Max = local_30.Max;
    pIVar1 = &(pIVar4->DC).LastItemStatusFlags;
    uVar11 = (pIVar4->DC).LastItemStatusFlags;
    if (pIVar6->ActiveIdHasBeenEditedThisFrame == true) {
      *pIVar1 = uVar11 | 0x14;
      if (cVar8 != '\0') {
        uVar11 = uVar11 | 4;
LAB_002d3112:
        if (pIVar6->ActiveId != pIVar6->ActiveIdPreviousFrame) {
          (pIVar4->DC).LastItemStatusFlags = uVar11 | 0x30;
        }
      }
    }
    else {
      *pIVar1 = uVar11 | 0x10;
      if (cVar8 != '\0') goto LAB_002d3112;
    }
  }
  uVar11 = (pIVar4->DC).GroupStack.Size;
  if ((int)uVar11 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                  ,0x4f3,"void ImVector<ImGuiGroupData>::pop_back() [T = ImGuiGroupData]");
  }
LAB_002d3131:
  (pIVar4->DC).GroupStack.Size = uVar11 - 1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());  // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return

    if (!group_data.EmitItem)
    {
        window->DC.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize(), 0.0f);
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The tests not symmetrical because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = !group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive;
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    window->DC.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}